

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

type CLI::detail::checked_multiply<int>(int *a,int b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  type_conflict tVar4;
  int local_1c;
  int *piStack_18;
  int b_local;
  int *a_local;
  
  if ((((*a == 0) || (b == 0)) || (*a == 1)) || (b == 1)) {
    *a = b * *a;
    a_local._7_1_ = true;
  }
  else {
    iVar3 = *a;
    local_1c = b;
    piStack_18 = a;
    iVar2 = std::numeric_limits<int>::min();
    iVar1 = local_1c;
    if ((iVar3 != iVar2) && (iVar3 = std::numeric_limits<int>::min(), iVar1 != iVar3)) {
      tVar4 = overflowCheck<int>(piStack_18,&local_1c);
      if (tVar4 != 0) {
        return false;
      }
      *piStack_18 = local_1c * *piStack_18;
      return true;
    }
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type checked_multiply(T &a, T b) {
    if(a == 0 || b == 0 || a == 1 || b == 1) {
        a *= b;
        return true;
    }
    if(a == (std::numeric_limits<T>::min)() || b == (std::numeric_limits<T>::min)()) {
        return false;
    }
    if(overflowCheck(a, b)) {
        return false;
    }
    a *= b;
    return true;
}